

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

string * slang::ast::getLexicalPath_abi_cxx11_(Scope *scope)

{
  Symbol *pSVar1;
  Scope *in_RSI;
  string *in_RDI;
  Symbol *sym;
  string *str;
  string *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  string *this;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RSI == (Scope *)0x0) ||
     (this = in_RDI, pSVar1 = Scope::asSymbol(in_RSI), pSVar1->kind == CompilationUnit)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  else {
    std::__cxx11::string::string(this);
    pSVar1 = Scope::asSymbol(in_RSI);
    Symbol::appendLexicalPath(pSVar1,in_stack_ffffffffffffffa8);
    if (((pSVar1->kind == Package) || (pSVar1->kind == ClassType)) ||
       (pSVar1->kind == CovergroupType)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this,in_stack_ffffffffffffffb8);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,(char)((ulong)in_stack_ffffffffffffffb8 >> 0x38));
    }
  }
  return in_RDI;
}

Assistant:

static std::string getLexicalPath(const Scope* scope) {
    if (!scope || scope->asSymbol().kind == SymbolKind::CompilationUnit)
        return "";

    std::string str;
    auto& sym = scope->asSymbol();
    sym.appendLexicalPath(str);

    if (sym.kind == SymbolKind::Package || sym.kind == SymbolKind::ClassType ||
        sym.kind == SymbolKind::CovergroupType) {
        str.append("::");
    }
    else {
        str.push_back('.');
    }

    return str;
}